

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::try_move_from(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *other)

{
  bool bVar1;
  allocator_type *__a;
  allocator_type *__b;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *other_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  __a = get_allocator(other);
  __b = get_allocator(this);
  bVar1 = std::pmr::operator==(__a,__b);
  if (bVar1) {
    move_from(this,other);
  }
  else {
    copy_from(this,other);
  }
  return;
}

Assistant:

void try_move_from(flat_forward_list &&other) {
        if (other.get_allocator() == get_allocator()) {
            move_from(std::move(other));
        } else {
            copy_from(other);
        }
    }